

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::ForthStack<double>::push(ForthStack<double> *this,double x)

{
  Cell CVar1;
  uint uVar2;
  size_type sVar3;
  AbortException *this_00;
  reference pvVar4;
  Cell index1;
  double x_local;
  ForthStack<double> *this_local;
  
  CVar1 = this->top;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(&this->stack);
  if (sVar3 <= CVar1 + 1) {
    this_00 = (AbortException *)__cxa_allocate_exception(0x10);
    AbortException::AbortException(this_00,"Forth stack overflow");
    __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
  }
  uVar2 = this->top + 1;
  this->top = uVar2;
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&this->stack,(ulong)uVar2);
  *pvVar4 = x;
  return;
}

Assistant:

void push(CellType x) {
				{auto index1 = top + 1;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(++top) = x;
			}